

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

float64 cluster(int32 ts,uint32 n_stream,uint32 n_in_frame,uint32 *veclen,uint32 blksize,
               vector_t **mean,uint32 n_density,codew_t **out_label)

{
  int *piVar1;
  vector_t pfVar2;
  vector_t pfVar3;
  vector_t pfVar4;
  vector_t pfVar5;
  float32 *pfVar6;
  void *pvVar7;
  uint32 n_obs;
  int iVar8;
  uint uVar9;
  cmd_ln_t *pcVar10;
  char *__s1;
  long lVar11;
  vector_t *ppfVar12;
  ulong uVar13;
  void *pvVar14;
  uint uVar15;
  vector_t *ppfVar16;
  ulong uVar17;
  uint32 veclen_00;
  void *pvVar18;
  ulong uVar19;
  ulong uVar20;
  size_t sVar21;
  ulong n_elem;
  float fVar22;
  double dVar23;
  float64 fVar24;
  vector_t *local_d0;
  void *local_c8;
  void *local_c0;
  vector_t *local_b8;
  vector_t *local_b0;
  void *local_a8;
  ulong local_a0;
  uint32 local_94;
  long local_90;
  ulong local_88;
  vector_t *local_80;
  uint32 local_74;
  uint32 local_70;
  uint32 local_6c;
  uint32 *local_68;
  vector_t **local_60;
  vector_t *local_58;
  ulong local_50;
  double local_48;
  ulong local_40;
  ulong local_38;
  
  *out_label = (codew_t *)0x0;
  local_74 = ts;
  local_70 = n_in_frame;
  local_6c = blksize;
  local_60 = mean;
  k_means_set_get_obs(get_obs);
  if (n_stream == 0) {
    local_48 = 0.0;
  }
  else {
    uVar13 = (ulong)n_density;
    local_40 = 2;
    if (2 < n_density) {
      local_40 = (ulong)n_density;
    }
    local_50 = (ulong)n_stream;
    local_48 = 0.0;
    fVar24 = 0.0;
    uVar20 = 0;
    local_94 = n_stream;
    local_68 = veclen;
    local_38 = uVar13;
    do {
      pcVar10 = cmd_ln_get();
      __s1 = cmd_ln_str_r(pcVar10,"-method");
      n_obs = setup_obs(local_74,(uint32)uVar20,local_70,n_stream,veclen,local_6c);
      iVar8 = strcmp(__s1,"rkm");
      if (iVar8 == 0) {
        pcVar10 = cmd_ln_get();
        lVar11 = cmd_ln_int_r(pcVar10,"-ntrial");
        uVar15 = veclen[uVar20];
        uVar19 = (ulong)uVar15;
        local_80 = local_60[uVar20];
        local_88 = uVar20;
        pcVar10 = cmd_ln_get();
        dVar23 = cmd_ln_float_r(pcVar10,"-minratio");
        pcVar10 = cmd_ln_get();
        local_b0 = (vector_t *)cmd_ln_int_r(pcVar10,"-maxiter");
        local_d0 = (vector_t *)0x0;
        ppfVar12 = (vector_t *)
                   __ckd_calloc_2d__(uVar13,uVar19,4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/kmeans_init/main.c"
                                     ,0x23f);
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/kmeans_init/main.c"
                ,0x241,"Initializing means using random k-means\n");
        local_90 = lVar11;
        if ((int)lVar11 == 0) {
          ppfVar16 = (vector_t *)0x0;
          fVar22 = INFINITY;
        }
        else {
          local_a0 = CONCAT44(local_a0._4_4_,(float)dVar23);
          pvVar18 = (void *)0x0;
          local_c8 = (void *)0x7fb9a2028368022e;
          local_b8 = (vector_t *)0x0;
          do {
            local_c0 = pvVar18;
            err_msg(ERR_INFO,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/kmeans_init/main.c"
                    ,0x244,"Trial %u: %u means\n",pvVar18,(ulong)n_density);
            iVar8 = 100;
            do {
              if (n_density == 0) {
LAB_00104f6f:
                local_a8 = (void *)k_means(ppfVar12,n_density,n_obs,uVar15,(float32)local_a0,
                                           (uint32)local_b0,(codew_t **)&local_d0);
              }
              else {
                sVar21 = 0;
                do {
                  dVar23 = drand48();
                  pfVar6 = obuf;
                  uVar9 = (uint)(long)((float)dVar23 * (float)n_obs);
                  if (n_obs <= uVar9) {
                    __assert_fail("(cc >= 0) && (cc < n_obs)",
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/kmeans_init/main.c"
                                  ,0x24c,
                                  "float32 random_kmeans(uint32, uint32, uint32, vector_t *, uint32, float32, uint32, codew_t **)"
                                 );
                  }
                  if (uVar19 != 0) {
                    uVar9 = uVar9 * vlen;
                    pfVar2 = ppfVar12[sVar21];
                    uVar20 = 0;
                    do {
                      pfVar2[uVar20] = (float)pfVar6[uVar9 + uVar20];
                      uVar20 = uVar20 + 1;
                    } while (uVar19 != uVar20);
                  }
                  sVar21 = sVar21 + 1;
                } while (sVar21 != uVar13);
                if (n_density < 2) goto LAB_00104f6f;
                local_a8 = (void *)k_means_trineq(ppfVar12,n_density,n_obs,uVar15,(float32)local_a0,
                                                  (uint32)local_b0,(codew_t **)&local_d0);
              }
              if (0.0 <= (double)local_a8) break;
              err_msg(ERR_INFO,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/kmeans_init/main.c"
                      ,0x265,"\t-> Aborting k-means, bad initialization\n");
              iVar8 = iVar8 + -1;
            } while (iVar8 != 0);
            if ((double)local_c8 <= (double)local_a8) {
              if (local_d0 != (vector_t *)0x0) {
                ckd_free(local_d0);
                local_d0 = (vector_t *)0x0;
              }
LAB_0010508c:
              iVar8 = (int)local_c0;
            }
            else {
              err_msg(ERR_INFO,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/kmeans_init/main.c"
                      ,0x26e,"\tbest-so-far sqerr = %e\n",local_a8);
              if (local_b8 != (vector_t *)0x0) {
                ckd_free(local_b8);
              }
              local_b8 = local_d0;
              if (n_density == 0) {
                local_c8 = local_a8;
                goto LAB_0010508c;
              }
              sVar21 = 0;
              iVar8 = (int)local_c0;
              do {
                if (uVar19 != 0) {
                  pfVar2 = ppfVar12[sVar21];
                  pfVar3 = local_80[sVar21];
                  uVar20 = 0;
                  do {
                    pfVar3[uVar20] = pfVar2[uVar20];
                    uVar20 = uVar20 + 1;
                  } while (uVar19 != uVar20);
                }
                sVar21 = sVar21 + 1;
              } while (sVar21 != uVar13);
              local_c8 = local_a8;
            }
            pvVar18 = (void *)(ulong)(iVar8 + 1U);
          } while (iVar8 + 1U != (uint)local_90);
          fVar22 = (float)(double)local_c8;
          ppfVar16 = local_b8;
        }
        *out_label = (codew_t *)ppfVar16;
        ckd_free_2d(ppfVar12);
        if (fVar22 < 0.0) {
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/kmeans_init/main.c"
                  ,0x349,"Too few observations for kmeans\n");
          return -1.0;
        }
        fVar24 = (float64)(double)fVar22;
        uVar20 = local_88;
        veclen = local_68;
        n_stream = local_94;
      }
      else {
        iVar8 = strcmp(__s1,"fnkm");
        if (iVar8 == 0) {
          uVar15 = veclen[uVar20];
          local_58 = local_60[uVar20];
          local_88 = uVar20;
          pcVar10 = cmd_ln_get();
          dVar23 = cmd_ln_float_r(pcVar10,"-minratio");
          local_b8 = (vector_t *)CONCAT44(local_b8._4_4_,(float)dVar23);
          pcVar10 = cmd_ln_get();
          local_90 = cmd_ln_int_r(pcVar10,"-maxiter");
          local_a0 = (ulong)n_obs;
          local_d0 = (vector_t *)
                     __ckd_calloc__(local_a0,4,
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/kmeans_init/main.c"
                                    ,0x2f1);
          local_c0 = __ckd_calloc__(uVar13,4,
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/kmeans_init/main.c"
                                    ,0x2f2);
          local_c8 = (void *)(ulong)uVar15;
          local_b0 = (vector_t *)
                     __ckd_calloc_2d__(2,(size_t)(ulong)uVar15,4,
                                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/kmeans_init/main.c"
                                       ,0x2f5);
          uVar19 = 0;
          n_elem = 1;
          do {
            err_msg(ERR_INFO,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/kmeans_init/main.c"
                    ,0x2f8,"n_mean == %u\n",n_elem & 0xffffffff);
            ppfVar12 = local_d0;
            local_a8 = __ckd_calloc__(n_elem,8,
                                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/kmeans_init/main.c"
                                      ,0x2c2);
            pvVar18 = local_c0;
            memset(local_c0,0,n_elem * 4);
            pvVar7 = local_a8;
            if (n_obs != 0) {
              uVar13 = 0;
              do {
                piVar1 = (int *)((long)pvVar18 + (ulong)*(uint *)((long)ppfVar12 + uVar13 * 4) * 4);
                *piVar1 = *piVar1 + 1;
                uVar13 = uVar13 + 1;
              } while (local_a0 != uVar13);
            }
            local_80 = ppfVar12;
            uVar13 = 0;
            do {
              pvVar14 = __ckd_calloc__((ulong)*(uint *)((long)pvVar18 + uVar13 * 4),4,
                                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/kmeans_init/main.c"
                                       ,0x2cc);
              *(void **)((long)pvVar7 + uVar13 * 8) = pvVar14;
              uVar13 = uVar13 + 1;
            } while (n_elem != uVar13);
            pvVar14 = __ckd_calloc__(n_elem,4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/kmeans_init/main.c"
                                     ,0x2cf);
            uVar13 = local_38;
            pvVar18 = local_c0;
            if (n_obs != 0) {
              uVar20 = 0;
              do {
                uVar17 = (ulong)*(uint *)((long)local_80 + uVar20 * 4);
                lVar11 = *(long *)((long)pvVar7 + uVar17 * 8);
                uVar15 = *(uint *)((long)pvVar14 + uVar17 * 4);
                *(uint *)((long)pvVar14 + uVar17 * 4) = uVar15 + 1;
                *(int *)(lVar11 + (ulong)uVar15 * 4) = (int)uVar20;
                uVar20 = uVar20 + 1;
              } while (local_a0 != uVar20);
            }
            uVar20 = 0;
            do {
              if (*(int *)((long)pvVar14 + uVar20 * 4) != *(int *)((long)local_c0 + uVar20 * 4)) {
                __assert_fail("free[k] == occ_cnt[k]",
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/kmeans_init/main.c"
                              ,0x2d8,"uint32 **cw_obs(codew_t *, uint32, uint32, uint32 *)");
              }
              uVar20 = uVar20 + 1;
            } while (n_elem != uVar20);
            ckd_free(pvVar14);
            pvVar7 = local_a8;
            uVar20 = 0;
            uVar15 = 0;
            do {
              uVar9 = *(uint *)((long)pvVar18 + uVar20 * 4);
              if (uVar15 < uVar9) {
                uVar19 = uVar20 & 0xffffffff;
                uVar15 = uVar9;
              }
              uVar20 = uVar20 + 1;
            } while (n_elem != uVar20);
            find_farthest_neigh(*(uint32 **)((long)local_a8 + uVar19 * 8),
                                *(uint32 *)((long)pvVar18 + uVar19 * 4),(uint32)local_c8,*local_b0,
                                local_b0[1]);
            err_msg(ERR_INFO,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/kmeans_init/main.c"
                    ,0x309,"d_max == %e\n");
            pvVar14 = local_c8;
            veclen_00 = (uint32)local_c8;
            k_means_subset(local_b0,2,*(uint32 **)((long)pvVar7 + uVar19 * 8),
                           *(uint32 *)((long)pvVar18 + uVar19 * 4),veclen_00,local_b8._0_4_,
                           (uint32)local_90,(codew_t **)0x0);
            if (pvVar14 != (void *)0x0) {
              pfVar2 = *local_b0;
              pfVar3 = local_b0[1];
              pfVar4 = local_58[uVar19];
              pfVar5 = local_58[n_elem];
              pvVar18 = (void *)0x0;
              do {
                pfVar4[(long)pvVar18] = pfVar2[(long)pvVar18];
                pfVar5[(long)pvVar18] = pfVar3[(long)pvVar18];
                pvVar18 = (void *)((long)pvVar18 + 1);
              } while (pvVar14 != pvVar18);
            }
            n_elem = n_elem + 1;
            ckd_free(local_d0);
            fVar24 = k_means(local_58,(uint32)n_elem,n_obs,veclen_00,local_b8._0_4_,(uint32)local_90
                             ,(codew_t **)&local_d0);
            err_msg(ERR_INFO,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/kmeans_init/main.c"
                    ,0x322,"\tsquerr == %e\n");
            uVar20 = local_88;
            veclen = local_68;
            n_stream = local_94;
          } while (n_elem != local_40);
        }
        else {
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/kmeans_init/main.c"
                  ,0x357,"I don\'t know how to do method \'%s\'.  Sorry.\n",__s1);
        }
      }
      uVar20 = uVar20 + 1;
      local_48 = local_48 + (double)fVar24;
    } while (uVar20 != local_50);
  }
  return (float64)local_48;
}

Assistant:

float64
cluster(int32 ts,
	uint32 n_stream,
	uint32 n_in_frame,
	uint32 *veclen,
	uint32 blksize,
	vector_t **mean,
	uint32 n_density,
	codew_t **out_label)
{
    float64 sum_sqerr, sqerr=0;
    uint32 s, n_frame;
    const char *meth;
    
    *out_label = NULL;

    k_means_set_get_obs(&get_obs);

    for (s = 0, sum_sqerr = 0; s < n_stream; s++, sum_sqerr += sqerr) {
	meth = cmd_ln_str("-method");

	n_frame = setup_obs(ts, s, n_in_frame, n_stream, veclen, blksize);

	if (strcmp(meth, "rkm") == 0) {
	    sqerr = random_kmeans(cmd_ln_int32("-ntrial"),
				  n_frame,
				  veclen[s],
				  mean[s],
				  n_density,
				  cmd_ln_float32("-minratio"),
				  cmd_ln_int32("-maxiter"),
				  out_label);
	    if (sqerr < 0) {
		E_ERROR("Too few observations for kmeans\n");
		
		return -1.0;
	    }
	}
	else if (strcmp(meth, "fnkm") == 0) {
	    sqerr = furthest_neighbor_kmeans(n_frame,
					     veclen[s],
					     mean[s],
					     n_density,
					     cmd_ln_float32("-minratio"),
					     cmd_ln_int32("-maxiter"));
	}
	else {
	    E_ERROR("I don't know how to do method '%s'.  Sorry.\n", meth);
	}
    }

    return sum_sqerr;
}